

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ImGuiWindow *pIVar7;
  int iVar8;
  undefined1 auVar9 [16];
  ImGuiContext *pIVar10;
  ImGuiID IVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  ImU32 col;
  ImGuiID close_button_id;
  size_t sVar15;
  undefined8 extraout_RAX;
  char *pcVar16;
  bool *pbVar17;
  ImGuiTabItem *pIVar18;
  int iVar19;
  uint uVar20;
  ImGuiCol idx;
  bool is_contents_visible;
  float fVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar22;
  bool text_clipped;
  bool just_closed;
  uint local_d8;
  ImGuiID local_d4;
  ImGuiContext *local_d0;
  ImVec2 local_c8;
  uint local_bc;
  undefined1 local_b8 [4];
  undefined1 auStack_b4 [12];
  ImDrawList *local_a8;
  ImGuiTabItem *local_a0;
  bool held;
  float local_94;
  ImGuiWindow *local_90;
  bool hovered;
  float fStack_84;
  uint local_7c;
  int local_78;
  int local_74;
  char *local_70;
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar10 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  if (pIVar7->SkipItems != false) {
    return false;
  }
  local_d4 = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,local_d4,(ImRect *)0x0,0x18);
    return false;
  }
  pbVar17 = (bool *)0x0;
  uVar20 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    pbVar17 = p_open;
    uVar20 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar20 = flags;
  }
  local_90 = pIVar7;
  IVar22 = TabItemCalcSize(label,pbVar17 != (bool *)0x0);
  IVar11 = local_d4;
  auStack_b4._4_4_ = extraout_XMM0_Dc;
  local_b8 = (undefined1  [4])IVar22.x;
  auStack_b4._0_4_ = IVar22.y;
  auStack_b4._8_4_ = extraout_XMM0_Dd;
  local_a0 = TabBarFindTabByID(tab_bar,local_d4);
  local_a8 = (ImDrawList *)local_a0;
  local_70 = label;
  if (local_a0 == (ImGuiTabItem *)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = -NAN;
    bb.Max.y = -NAN;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    pIVar18 = (tab_bar->Tabs).Data;
    iVar4 = (tab_bar->Tabs).Size;
    local_a0 = pIVar18 + (long)iVar4 + -1;
    local_a0->ID = IVar11;
    pIVar18[(long)iVar4 + -1].Width = (float)local_b8;
    tab_bar->TabsAddedNew = true;
  }
  else {
    pIVar18 = (tab_bar->Tabs).Data;
  }
  pcVar12 = local_70;
  tab_bar->LastTabItemIdx = (ImS16)(((long)local_a0 - (long)pIVar18) / 0x28);
  local_a0->ContentWidth = (float)local_b8;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  local_a0->BeginOrder = sVar3;
  local_bc = tab_bar->Flags;
  local_c8.x = (float)(tab_bar->PrevFrameVisible + 1);
  local_d0 = pIVar10;
  iVar4 = pIVar10->FrameCount;
  iVar19 = local_a0->LastFrameVisible + 1;
  local_a0->LastFrameVisible = iVar4;
  local_a0->Flags = uVar20;
  iVar5 = (tab_bar->TabsNames).Buf.Size;
  iVar8 = iVar5 + -1;
  if (iVar5 == 0) {
    iVar8 = 0;
  }
  local_a0->NameOffset = iVar8;
  sVar15 = strlen(local_70);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar12,pcVar12 + sVar15 + 1);
  pIVar7 = local_90;
  IVar11 = local_d4;
  if (((iVar19 < iVar4) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if ((int)local_c8.x < iVar4) {
      if ((uVar20 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_0015f938;
    }
    else if ((uVar20 >> 0x15 & 1) == 0) {
LAB_0015f938:
      tab_bar->NextSelectedTabId = local_d4;
    }
  }
  if ((((uVar20 & 2) != 0) && (tab_bar->SelectedTabId != local_d4)) && ((uVar20 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = local_d4;
  }
  if (tab_bar->VisibleTabId == local_d4) {
    tab_bar->VisibleTabWasSubmitted = true;
    is_contents_visible = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && (int)local_c8.x < iVar4) && ((tab_bar->Tabs).Size == 1))
  {
    is_contents_visible = (tab_bar->Flags & 2) == 0;
  }
  else {
    is_contents_visible = false;
  }
  if ((iVar19 < iVar4) && (local_a8 == (ImDrawList *)0x0 || iVar4 <= (int)local_c8.x)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,local_d4,(ImRect *)0x0,0x18);
    return (bool)((uVar20 >> 0x15 & 1) == 0 & is_contents_visible);
  }
  if (tab_bar->SelectedTabId == local_d4) {
    local_a0->LastFrameSelected = local_d0->FrameCount;
  }
  uVar6 = local_a0->Flags;
  fVar2 = local_a0->Width;
  fVar21 = local_a0->Offset;
  if ((uVar6 & 0xc0) == 0) {
    fVar21 = (float)(int)(fVar21 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar21 + (tab_bar->BarRect).Min.x;
  local_c8 = (local_90->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar22.y = bb.Min.y;
  IVar22.x = bb.Min.x;
  (local_90->DC).CursorPos = IVar22;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = (float)auStack_b4._0_4_ + bb.Min.y;
  local_d8 = uVar20;
  local_78 = iVar19;
  local_74 = iVar4;
  if ((uVar6 & 0xc0) == 0) {
    fVar2 = tab_bar->ScrollingRectMinX;
    if ((fVar2 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_0015fa8d;
    fStack_84 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      (uint)bb.Min.x & -(uint)(fVar2 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_94 = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    local_b8 = (undefined1  [4])(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
LAB_0015fa8d:
    auVar9._12_4_ = 0;
    auVar9._0_12_ = auStack_b4;
    _local_b8 = auVar9 << 0x20;
  }
  pIVar10 = local_d0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_84 = bb.Max.y - bb.Min.y;
  IVar22 = (pIVar7->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_d0->Style).FramePadding.y);
  (pIVar7->DC).CursorMaxPos = IVar22;
  bVar13 = ItemAdd(&bb,IVar11,(ImRect *)0x0,0);
  if (!bVar13) {
    if (local_b8[0] != '\0') {
      PopClipRect();
    }
    (local_90->DC).CursorPos = local_c8;
    return is_contents_visible;
  }
  uVar20 = local_d8 & 0x200000;
  bVar13 = ButtonBehavior(&bb,IVar11,&hovered,&held,
                          (uVar20 >> 0x11) + (uint)pIVar10->DragDropActive * 0x200 + 0x1010);
  pIVar7 = local_90;
  if ((bVar13) && (uVar20 == 0)) {
    tab_bar->NextSelectedTabId = IVar11;
  }
  local_7c = uVar20;
  if (local_d0->ActiveId != IVar11) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && (local_74 <= local_78)) && (bVar14 = IsMouseDragging(0,-1.0), bVar14)) &&
      ((local_d0->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar2 = (local_d0->IO).MouseDelta.x, fVar2 < 0.0 &&
       (pIVar1 = &(local_d0->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar2 && (bb.Max.x < (local_d0->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,local_a0,(local_d0->IO).MousePos);
  }
  local_a8 = pIVar7->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (is_contents_visible == false) {
      idx = (uint)((local_bc >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_bc >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(local_a8,&bb,local_d8,col);
  RenderNavHighlight(&bb,IVar11,1);
  bVar14 = IsItemHovered(0x20);
  if (bVar14) {
    bVar14 = IsMouseClicked(1,false);
    if (bVar14) {
      uVar20 = local_d8 >> 0x15 & 1;
    }
    else {
      bVar14 = IsMouseReleased(1);
      uVar20 = local_7c;
      if (!bVar14) goto LAB_0015fd35;
    }
    if (uVar20 == 0) {
      tab_bar->NextSelectedTabId = IVar11;
    }
  }
LAB_0015fd35:
  uVar20 = (uint)tab_bar->Flags >> 1 & 4 | local_d8;
  if (pbVar17 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,IVar11);
  }
  pcVar12 = local_70;
  TabItemLabelAndCloseButton
            (local_a8,&bb,uVar20,tab_bar->FramePadding,local_70,IVar11,close_button_id,
             is_contents_visible,&just_closed,&text_clipped);
  if ((pbVar17 != (bool *)0x0) && (just_closed != false)) {
    *pbVar17 = false;
    TabBarCloseTab(tab_bar,local_a0);
  }
  pIVar10 = local_d0;
  if (local_b8[0] != '\0') {
    PopClipRect();
  }
  uVar20 = local_d8;
  (pIVar7->DC).CursorPos = local_c8;
  if ((((text_clipped == true) && (pIVar10->HoveredId == local_d4)) && (held == false)) &&
     (((pIVar10->TooltipSlowDelay <= pIVar10->HoveredIdNotActiveTimer &&
        pIVar10->HoveredIdNotActiveTimer != pIVar10->TooltipSlowDelay &&
       (bVar14 = IsItemHovered(0), bVar14)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((local_a0->Flags & 0x10) == 0)))))) {
    pcVar16 = FindRenderedTextEnd(pcVar12,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar16 - (int)pcVar12),pcVar12);
  }
  if ((uVar20 >> 0x15 & 1) == 0) {
    bVar13 = is_contents_visible;
  }
  return bVar13;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}